

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O1

Component __thiscall
ftxui::Slider<float>
          (ftxui *this,ConstStringRef *label,float *value,float min,float max,float increment)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_3d;
  float increment_local;
  float max_local;
  float min_local;
  SliderBase<float> *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  float *value_local;
  
  local_30 = (SliderBase<float> *)0x0;
  increment_local = increment;
  max_local = max;
  min_local = min;
  value_local = value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::SliderBase<float>,std::allocator<ftxui::SliderBase<float>>,ftxui::ConstStringRef&,float*&,float&,float&,float&>
            (&local_28,&local_30,(allocator<ftxui::SliderBase<float>_> *)&local_3d,label,
             &value_local,&min_local,&max_local,&increment_local);
  *(SliderBase<float> **)this = local_30;
  *(undefined8 *)(this + 8) = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_28._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Slider(ConstStringRef label, T* value, T min, T max, T increment) {
  return Make<SliderBase<T>>(std::move(label), value, min, max, increment);
}